

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O3

void __thiscall ami_nvar_t::_read(ami_nvar_t *this)

{
  bool bVar1;
  nvar_entry_t *in_RAX;
  pointer __p;
  nvar_entry_t *this_00;
  pointer *__ptr;
  _Head_base<0UL,_ami_nvar_t::nvar_entry_t_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  __p = (pointer)operator_new(0x18);
  (__p->
  super__Vector_base<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->
  super__Vector_base<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->
  super__Vector_base<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
           *)&this->m_entries,__p);
  while( true ) {
    this_00 = (nvar_entry_t *)operator_new(0x108);
    nvar_entry_t::nvar_entry_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
    local_28._M_head_impl = this_00;
    std::
    vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>
    ::
    emplace_back<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>
              ((vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>
                *)(this->m_entries)._M_t.
                  super___uniq_ptr_impl<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_*,_false>
                  ._M_head_impl,
               (unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>
                *)&local_28);
    if (local_28._M_head_impl != (nvar_entry_t *)0x0) {
      (*((local_28._M_head_impl)->super_kstruct)._vptr_kstruct[1])();
    }
    if (this_00->m_signature_first != 'N') break;
    bVar1 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
    if (bVar1) {
      return;
    }
  }
  return;
}

Assistant:

void ami_nvar_t::_read() {
    m_entries = std::unique_ptr<std::vector<std::unique_ptr<nvar_entry_t>>>(new std::vector<std::unique_ptr<nvar_entry_t>>());
    {
        int i = 0;
        nvar_entry_t* _;
        do {
            _ = new nvar_entry_t(m__io, this, m__root);
            m_entries->push_back(std::move(std::unique_ptr<nvar_entry_t>(_)));
            i++;
        } while (!( ((_->signature_first() != 78) || (_io()->is_eof())) ));
    }
}